

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O1

Shape * trieste::wf::ops::operator<<=(Shape *__return_storage_ptr__,Token *type,Field *field)

{
  initializer_list<trieste::wf::Field> __l;
  allocator_type local_51;
  Field local_50;
  vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_> local_30;
  undefined1 *local_18;
  
  local_50.name.def = (field->name).def;
  std::vector<trieste::Token,_std::allocator<trieste::Token>_>::vector
            (&local_50.choice.types,&(field->choice).types);
  __l._M_len = 1;
  __l._M_array = &local_50;
  std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>::vector
            (&local_30,__l,&local_51);
  local_18 = Invalid;
  (__return_storage_ptr__->type).def = type->def;
  std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>::vector
            ((vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_> *)
             &__return_storage_ptr__->shape,&local_30);
  *(undefined1 **)
   ((long)&(__return_storage_ptr__->shape).
           super__Variant_base<trieste::wf::Sequence,_trieste::wf::Fields>.
           super__Move_assign_alias<trieste::wf::Sequence,_trieste::wf::Fields>.
           super__Copy_assign_alias<trieste::wf::Sequence,_trieste::wf::Fields>.
           super__Move_ctor_alias<trieste::wf::Sequence,_trieste::wf::Fields>.
           super__Copy_ctor_alias<trieste::wf::Sequence,_trieste::wf::Fields>.
           super__Variant_storage_alias<trieste::wf::Sequence,_trieste::wf::Fields> + 0x18) =
       local_18;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->shape).
           super__Variant_base<trieste::wf::Sequence,_trieste::wf::Fields>.
           super__Move_assign_alias<trieste::wf::Sequence,_trieste::wf::Fields>.
           super__Copy_assign_alias<trieste::wf::Sequence,_trieste::wf::Fields>.
           super__Move_ctor_alias<trieste::wf::Sequence,_trieste::wf::Fields>.
           super__Copy_ctor_alias<trieste::wf::Sequence,_trieste::wf::Fields>.
           super__Variant_storage_alias<trieste::wf::Sequence,_trieste::wf::Fields> + 0x20) = '\x01'
  ;
  std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>::~vector(&local_30);
  if (local_50.choice.types.super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.choice.types.
                    super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.choice.types.
                          super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.choice.types.
                          super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Shape operator<<=(const Token& type, Field&& field)
      {
        return type <<= Fields{std::vector<Field>{field}, Invalid};
      }